

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O1

int __thiscall
delegating_shared_control_block<BaseType,_DerivedType>::clone
          (delegating_shared_control_block<BaseType,_DerivedType> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<shared_control_block<DerivedType>_> local_40;
  shared_control_block<BaseType> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  undefined1 local_19;
  
  (**(code **)(**(long **)(__fn + 8) + 0x10))(&local_40,*(long **)(__fn + 8),__child_stack,___flags)
  ;
  local_30._vptr_shared_control_block = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<delegating_shared_control_block<BaseType,DerivedType>,std::allocator<delegating_shared_control_block<BaseType,DerivedType>>,std::shared_ptr<shared_control_block<DerivedType>>>
            (&local_28,(delegating_shared_control_block<BaseType,_DerivedType> **)&local_30,
             (allocator<delegating_shared_control_block<BaseType,_DerivedType>_> *)&local_19,
             &local_40);
  _Var1._M_pi = local_28._M_pi;
  (this->super_shared_control_block<BaseType>)._vptr_shared_control_block =
       local_30._vptr_shared_control_block;
  (this->delegate_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->delegate_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_30._vptr_shared_control_block = (_func_int **)0x0;
  if (local_40.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (int)this;
}

Assistant:

std::shared_ptr<shared_control_block<T>> clone() const override
  {
    return std::make_shared<delegating_shared_control_block>(delegate_->clone());
  }